

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_par.cc
# Opt level: O0

char * ASN1_tag2str(int tag)

{
  uint local_14;
  char *pcStack_10;
  int tag_local;
  
  if ((tag == 0x102) || (local_14 = tag, tag == 0x10a)) {
    local_14 = tag & 0xfffffeff;
  }
  if (((int)local_14 < 0) || (0x1e < (int)local_14)) {
    pcStack_10 = "(unknown)";
  }
  else {
    pcStack_10 = ASN1_tag2str::tag2str[(int)local_14];
  }
  return pcStack_10;
}

Assistant:

const char *ASN1_tag2str(int tag) {
  static const char *const tag2str[] = {
      "EOC",
      "BOOLEAN",
      "INTEGER",
      "BIT STRING",
      "OCTET STRING",
      "NULL",
      "OBJECT",
      "OBJECT DESCRIPTOR",
      "EXTERNAL",
      "REAL",
      "ENUMERATED",
      "<ASN1 11>",
      "UTF8STRING",
      "<ASN1 13>",
      "<ASN1 14>",
      "<ASN1 15>",
      "SEQUENCE",
      "SET",
      "NUMERICSTRING",
      "PRINTABLESTRING",
      "T61STRING",
      "VIDEOTEXSTRING",
      "IA5STRING",
      "UTCTIME",
      "GENERALIZEDTIME",
      "GRAPHICSTRING",
      "VISIBLESTRING",
      "GENERALSTRING",
      "UNIVERSALSTRING",
      "<ASN1 29>",
      "BMPSTRING",
  };

  if ((tag == V_ASN1_NEG_INTEGER) || (tag == V_ASN1_NEG_ENUMERATED)) {
    tag &= ~V_ASN1_NEG;
  }

  if (tag < 0 || tag > 30) {
    return "(unknown)";
  }
  return tag2str[tag];
}